

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bezier.cpp
# Opt level: O0

Vector3 * __thiscall Bezier::getPoint(Bezier *this,double t,double theta)

{
  Vector3 *A;
  long in_RSI;
  Vector3 *in_RDI;
  double X;
  Vector3 *B;
  double in_XMM1_Qa;
  Vector3 *in_stack_fffffffffffffeb0;
  Vector3 *in_stack_fffffffffffffeb8;
  Vector3 *this_00;
  Vector3 local_100;
  Vector3 local_e8;
  double local_d0;
  double local_c8;
  Vector3 local_c0;
  Vector3 local_a8;
  Vector3 local_80;
  Vector3 local_68;
  Vector3 local_50;
  Vector3 local_38;
  double local_20;
  
  this_00 = in_RDI;
  local_20 = in_XMM1_Qa;
  X = Polynomial::operator()((Polynomial *)in_RDI,(double)in_RDI);
  Vector3::Vector3(&local_80,X);
  ::operator*(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  A = (Vector3 *)(in_RSI + 0x128);
  local_c8 = Polynomial::operator()((Polynomial *)this_00,(double)in_RDI);
  ::operator*(A,&in_stack_fffffffffffffeb0->x);
  local_d0 = cos(local_20);
  ::operator*(A,&in_stack_fffffffffffffeb0->x);
  operator+(A,in_stack_fffffffffffffeb0);
  B = (Vector3 *)Polynomial::operator()((Polynomial *)this_00,(double)in_RDI);
  ::operator*(A,(double *)B);
  sin(local_20);
  ::operator*(A,&B->x);
  operator+(A,B);
  Vector3::~Vector3(&local_e8);
  Vector3::~Vector3(&local_100);
  Vector3::~Vector3(&local_38);
  Vector3::~Vector3(&local_a8);
  Vector3::~Vector3(&local_c0);
  Vector3::~Vector3(&local_50);
  Vector3::~Vector3(&local_68);
  Vector3::~Vector3(&local_80);
  return this_00;
}

Assistant:

Vector3 Bezier::getPoint(double t, double theta)
{
    return P + py(t) * Dz + Dx * px(t) * cos(theta) + Dy * px(t) * sin(theta);
}